

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O1

void EMIT_OP_REG_REG(CodeGenGenericContext *ctx,x86Command op,x86Reg reg1,x86Reg reg2)

{
  ArgType AVar1;
  x86Instruction *pxVar2;
  ulong uVar3;
  x86Reg xVar4;
  uint uVar5;
  x86Size size;
  x86Reg index;
  int multiplier;
  undefined4 uStack_44;
  undefined4 uStack_3c;
  
  switch(op) {
  case o_add:
  case o_sub:
    if (ctx->genReg[reg2].type == argReg) {
      reg2 = ctx->genReg[reg2].field_1.reg;
    }
    uVar3 = (ulong)reg2;
    if (ctx->genReg[uVar3].type == argNumber) {
      uVar5 = ctx->genReg[uVar3].field_1.labelID;
      goto LAB_001e4299;
    }
    break;
  case o_imul:
    if ((ctx->genReg[reg2].type == argPtr) && (ctx->genReg[reg2].field_1.reg == rECX)) {
      xVar4 = ctx->genReg[reg2].ptrBase;
      index = ctx->genReg[reg2].ptrIndex;
      multiplier = ctx->genReg[reg2].ptrMult;
      uVar5 = ctx->genReg[reg2].ptrNum;
      op = o_imul;
      size = sDWORD;
      goto LAB_001e44d5;
    }
LAB_001e44a2:
    uVar3 = (ulong)reg2;
    break;
  case o_idiv:
  case o_shl:
  case o_not:
switchD_001e418c_caseD_22:
    __assert_fail("!\"unknown instruction\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                  ,0x54d,"void EMIT_OP_REG_REG(CodeGenGenericContext &, x86Command, x86Reg, x86Reg)"
                 );
  case o_sal:
  case o_sar:
switchD_001e418c_caseD_24:
    uVar3 = (ulong)reg2;
    AVar1 = ctx->genReg[uVar3].type;
    if (AVar1 == argReg) {
      xVar4 = ctx->genReg[uVar3].field_1.reg;
    }
    else {
      xVar4 = reg2;
      if ((AVar1 == argNumber) &&
         (uVar5 = ctx->genReg[uVar3].field_1.labelID, (int)(char)uVar5 == uVar5)) goto LAB_001e4299;
    }
    if ((ctx->genReg[xVar4].type == argNumber) &&
       (uVar5 = ctx->genReg[xVar4].field_1.labelID, (int)(char)uVar5 == uVar5)) {
LAB_001e4299:
      EMIT_OP_REG_NUM(ctx,op,reg1,uVar5);
      return;
    }
    break;
  case o_xor:
switchD_001e418c_caseD_29:
    if (reg1 == reg2) {
      if (ctx->genRegRead[reg1] == false) {
        if (ctx->x86Base[ctx->genRegUpdate[reg1]].name != o_none) {
          ctx->x86Base[ctx->genRegUpdate[reg1]].name = o_none;
          ctx->optimizationCount = ctx->optimizationCount + 1;
        }
      }
      ctx->genReg[reg1].type = argNone;
      CodeGenGenericContext::InvalidateDependand(ctx,reg1);
      goto LAB_001e436a;
    }
  case o_adc:
  case o_sbb:
  case o_and:
  case o_or:
switchD_001e418c_caseD_1e:
    if (ctx->genReg[reg2].type == argReg) {
      reg2 = ctx->genReg[reg2].field_1.reg;
    }
    uVar3 = (ulong)reg2;
    break;
  case o_cmp:
switchD_001e418c_caseD_2a:
    if (ctx->genReg[reg1].type == argReg) {
      reg1 = ctx->genReg[reg1].field_1.reg;
    }
    if (ctx->genReg[reg2].type == argReg) {
      reg2 = ctx->genReg[reg2].field_1.reg;
    }
    AVar1 = ctx->genReg[reg2].type;
    if (AVar1 == argPtr) {
      size = ctx->genReg[reg2].field_1.ptrSize;
      if (size == (op != o_cmp) + sDWORD) {
        xVar4 = ctx->genReg[reg2].ptrBase;
        index = ctx->genReg[reg2].ptrIndex;
        multiplier = ctx->genReg[reg2].ptrMult;
        uVar5 = ctx->genReg[reg2].ptrNum;
LAB_001e44d5:
        EMIT_OP_REG_RPTR(ctx,op,reg1,size,index,multiplier,xVar4,uVar5);
        return;
      }
    }
    else if (AVar1 == argNumber) {
      uVar5 = ctx->genReg[reg2].field_1.labelID;
      goto LAB_001e4299;
    }
    ctx->genRegRead[reg1] = true;
    ctx->genRegRead[reg2] = true;
    goto LAB_001e436a;
  case o_test:
    if (ctx->genReg[reg1].type == argReg) {
      reg1 = ctx->genReg[reg1].field_1.reg;
    }
    if (ctx->genReg[reg2].type == argReg) {
      reg2 = ctx->genReg[reg2].field_1.reg;
    }
    ctx->genRegRead[reg1] = true;
    ctx->genRegRead[reg2] = true;
    goto LAB_001e436a;
  default:
    switch(op) {
    case o_neg64:
    case o_idiv64:
    case o_not64:
      goto switchD_001e418c_caseD_22;
    case o_add64:
    case o_sub64:
    case o_and64:
    case o_or64:
      goto switchD_001e418c_caseD_1e;
    case o_imul64:
      if ((ctx->genReg[reg2].type == argPtr) && (ctx->genReg[reg2].field_1.reg == rEDX)) {
        xVar4 = ctx->genReg[reg2].ptrBase;
        index = ctx->genReg[reg2].ptrIndex;
        multiplier = ctx->genReg[reg2].ptrMult;
        uVar5 = ctx->genReg[reg2].ptrNum;
        op = o_imul64;
        size = sQWORD;
        goto LAB_001e44d5;
      }
      goto LAB_001e44a2;
    case o_sal64:
    case o_sar64:
      goto switchD_001e418c_caseD_24;
    case o_xor64:
      goto switchD_001e418c_caseD_29;
    case o_cmp64:
      goto switchD_001e418c_caseD_2a;
    default:
      if (op != o_mov) goto switchD_001e418c_caseD_22;
    case o_mov64:
      if (ctx->skipTracking == false) {
        if (ctx->genReg[reg2].type == argReg) {
          reg2 = ctx->genReg[reg2].field_1.reg;
        }
        if (reg2 == reg1) {
          ctx->optimizationCount = ctx->optimizationCount + 1;
          return;
        }
        ctx->genRegRead[reg2] = true;
        CodeGenGenericContext::OverwriteRegisterWithValue
                  (ctx,reg1,(x86Argument)
                            ZEXT1632(CONCAT88(CONCAT44(uStack_3c,reg2),CONCAT44(uStack_44,2))));
      }
    }
    goto LAB_001e436a;
  }
  ctx->genRegRead[uVar3] = true;
  CodeGenGenericContext::InvalidateDependand(ctx,reg1);
  ctx->genReg[reg1].type = argNone;
  ctx->genRegUpdate[reg1] = (int)((ulong)((long)ctx->x86Op - (long)ctx->x86Base) >> 4) * -0x33333333
  ;
  ctx->genRegRead[reg1] = false;
LAB_001e436a:
  pxVar2 = ctx->x86Op;
  pxVar2->name = op;
  (pxVar2->argA).type = argReg;
  (pxVar2->argA).field_1.reg = reg1;
  pxVar2 = ctx->x86Op;
  (pxVar2->argB).type = argReg;
  (pxVar2->argB).field_1.reg = reg2;
  ctx->x86Op = ctx->x86Op + 1;
  return;
}

Assistant:

void EMIT_OP_REG_REG(CodeGenGenericContext &ctx, x86Command op, x86Reg reg1, x86Reg reg2)
{
#ifdef NULLC_OPTIMIZE_X86
	switch(op)
	{
	case o_xor:
	case o_xor64:
		if(reg1 == reg2)
		{
			ctx.KillRegister(reg1);
			ctx.InvalidateDependand(reg1);
		}
		else
		{
			reg2 = ctx.RedirectRegister(reg2);

			ctx.ReadRegister(reg2);
			ctx.ReadAndModifyRegister(reg1);
		}
		break;
	case o_cmp:
	case o_cmp64:
		reg1 = ctx.RedirectRegister(reg1);
		reg2 = ctx.RedirectRegister(reg2);

		// Load source directly from memory
		if(ctx.genReg[reg2].type == x86Argument::argNumber)
		{
			EMIT_OP_REG_NUM(ctx, op, reg1, ctx.genReg[reg2].num);
			return;
		}

		// Load source directly from memory
		if(ctx.genReg[reg2].type == x86Argument::argPtr && ctx.genReg[reg2].ptrSize == (op == o_cmp ? sDWORD : sQWORD))
		{
			EMIT_OP_REG_RPTR(ctx, op, reg1, ctx.genReg[reg2].ptrSize, ctx.genReg[reg2].ptrIndex, ctx.genReg[reg2].ptrMult, ctx.genReg[reg2].ptrBase, ctx.genReg[reg2].ptrNum);
			return;
		}

		ctx.ReadRegister(reg1);
		ctx.ReadRegister(reg2);
		break;
	case o_test:
		reg1 = ctx.RedirectRegister(reg1);
		reg2 = ctx.RedirectRegister(reg2);

		ctx.ReadRegister(reg1);
		ctx.ReadRegister(reg2);
		break;
	case o_add:
	case o_sub:
		reg2 = ctx.RedirectRegister(reg2);

		if(ctx.genReg[reg2].type == x86Argument::argNumber)
		{
			EMIT_OP_REG_NUM(ctx, op, reg1, ctx.genReg[reg2].num);
			return;
		}

		// TODO: if there is a known number in destination, we can perform a lea

		ctx.ReadRegister(reg2);
		ctx.ReadAndModifyRegister(reg1);
		break;
	case o_adc:
	case o_sbb:
		reg2 = ctx.RedirectRegister(reg2);

		ctx.ReadRegister(reg2);
		ctx.ReadAndModifyRegister(reg1);
		break;
	case o_add64:
	case o_sub64:
		reg2 = ctx.RedirectRegister(reg2);

		ctx.ReadRegister(reg2);
		ctx.ReadAndModifyRegister(reg1);
		break;
	case o_sal:
	case o_sar:
	case o_sal64:
	case o_sar64:
		// Can't redirect source register since the instruction has it fixed to ecx

		if(ctx.genReg[reg2].type == x86Argument::argNumber && (char)ctx.genReg[reg2].num == ctx.genReg[reg2].num)
		{
			EMIT_OP_REG_NUM(ctx, op, reg1, ctx.genReg[reg2].num);
			return;
		}

		{
			x86Reg redirect = ctx.RedirectRegister(reg2);

			if(ctx.genReg[redirect].type == x86Argument::argNumber && (char)ctx.genReg[redirect].num == ctx.genReg[redirect].num)
			{
				EMIT_OP_REG_NUM(ctx, op, reg1, ctx.genReg[redirect].num);
				return;
			}
		}

		ctx.ReadRegister(reg2);
		ctx.ReadAndModifyRegister(reg1);
		break;
	case o_and:
	case o_or:
		reg2 = ctx.RedirectRegister(reg2);

		ctx.ReadRegister(reg2);
		ctx.ReadAndModifyRegister(reg1);
		break;
	case o_and64:
	case o_or64:
		reg2 = ctx.RedirectRegister(reg2);

		ctx.ReadRegister(reg2);
		ctx.ReadAndModifyRegister(reg1);
		break;
	case o_imul:
		// Load source directly from memory
		if(ctx.genReg[reg2].type == x86Argument::argPtr && ctx.genReg[reg2].ptrSize == sDWORD)
		{
			EMIT_OP_REG_RPTR(ctx, op, reg1, ctx.genReg[reg2].ptrSize, ctx.genReg[reg2].ptrIndex, ctx.genReg[reg2].ptrMult, ctx.genReg[reg2].ptrBase, ctx.genReg[reg2].ptrNum);
			return;
		}

		ctx.ReadRegister(reg2);
		ctx.ReadAndModifyRegister(reg1);
		break;
	case o_imul64:
		// Load source directly from memory
		if(ctx.genReg[reg2].type == x86Argument::argPtr && ctx.genReg[reg2].ptrSize == sQWORD)
		{
			EMIT_OP_REG_RPTR(ctx, op, reg1, ctx.genReg[reg2].ptrSize, ctx.genReg[reg2].ptrIndex, ctx.genReg[reg2].ptrMult, ctx.genReg[reg2].ptrBase, ctx.genReg[reg2].ptrNum);
			return;
		}

		ctx.ReadRegister(reg2);
		ctx.ReadAndModifyRegister(reg1);
		break;
	case o_mov:
	case o_mov64:
		if(ctx.skipTracking)
			break;

		reg2 = ctx.RedirectRegister(reg2);

		// Skip self-assignment
		if(reg1 == reg2)
		{
			ctx.optimizationCount++;
			return;
		}

		ctx.ReadRegister(reg2);

		ctx.OverwriteRegisterWithValue(reg1, x86Argument(reg2));
		break;
	default:
		assert(!"unknown instruction");
	}
#endif

	ctx.x86Op->name = op;
	ctx.x86Op->argA.type = x86Argument::argReg;
	ctx.x86Op->argA.reg = reg1;
	ctx.x86Op->argB.type = x86Argument::argReg;
	ctx.x86Op->argB.reg = reg2;
	ctx.x86Op++;
}